

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O1

int zt_unit_main(zt_unit *unit,int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (1 < argc) {
    uVar3 = 1;
    do {
      __s1 = argv[uVar3];
      iVar1 = strcmp(__s1,"-h");
      if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"--help"), iVar1 == 0)) {
        printf("%s %s",*argv,
               "[options] <suite | suite.test> ...\n\nOptions:\n     -h, --help               This help text\n     -l, --list               list suites and test (default disabled)\n"
              );
        return 0;
      }
      iVar1 = strcmp(__s1,"-l");
      if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"--list"), iVar1 == 0)) {
        zt_unit_list(unit);
        return 0;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  if (argc < 2) {
    zt_unit_run(unit);
    iVar1 = 0;
  }
  else {
    uVar3 = 1;
    iVar1 = 0;
    do {
      iVar2 = zt_unit_run_by_name(unit,argv[uVar3]);
      if (iVar2 < 0) {
        printf("Suite or Test \"%s\" not found\n",argv[uVar3]);
        iVar1 = -1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  if (iVar1 == 0) {
    iVar1 = -(uint)(unit->failures != 0);
  }
  return iVar1;
}

Assistant:

int
zt_unit_main(struct zt_unit    * unit,
             int argc,
             char    * argv[])
{
    int                i;
    int                result = 0;

    char * msg = "[options] <suite | suite.test> ..."NL
                ""NL
                "Options:"NL
                "     -h, --help               This help text"NL
                "     -l, --list               list suites and test (default disabled)"NL;

    for(i=1; i < argc; i++) {
        if(strcmp(argv[i], "-h") == 0 ||
           strcmp(argv[i], "--help") == 0) {
            printf("%s %s", argv[0], msg);
            return 0;
        } else if(strcmp(argv[i], "-l") == 0 ||
                  strcmp(argv[i], "--list") == 0) {
            zt_unit_list(unit);
            return 0;
        }
    }

    if (argc > 1) {
        for (i = 1; i < argc; i++) {
            if (zt_unit_run_by_name(unit, argv[i]) < 0) {
                printf("Suite or Test \"%s\" not found\n", argv[i]);
                result = -1;
            }
        }
    } else {
        if ((result = zt_unit_run(unit)) < 0) {
            return result;
        }
    }

    if (result == 0) {
        if (unit->failures > 0) {
            result = -1;
        }
    }
    return result;
}